

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InternalString.cpp
# Opt level: O0

void __thiscall
Js::InternalString::InternalString
          (InternalString *this,char16 *content,charcount_t length,uchar offset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uchar offset_local;
  charcount_t length_local;
  char16 *content_local;
  InternalString *this_local;
  
  this->m_charLength = length;
  this->m_offset = offset;
  Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierPtr(&this->m_content,content);
  if (0x7ffffffe < length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/InternalString.cpp"
                                ,0x10,"(length < 2147483647)",
                                "Length should be a valid string length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

InternalString::InternalString(const char16* content, charcount_t length, unsigned char offset):
        m_content(content),
        m_charLength(length),
        m_offset(offset)
    {
        AssertMsg(length < INT_MAX, "Length should be a valid string length");
    }